

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_ai::load(xr_level_ai *this,xr_reader *r)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  ulong uVar3;
  ai_node *paVar4;
  bool bVar5;
  float fVar6;
  double dVar7;
  xr_reader *r_local;
  xr_level_ai *this_local;
  
  uVar2 = xr_reader::r_u32(r);
  this->m_version = uVar2;
  if ((this->m_version < 4) || (bVar5 = true, 10 < this->m_version)) {
    bVar5 = this->m_version == 3;
  }
  if (bVar5) {
    uVar2 = xr_reader::r_u32(r);
    this->m_num_nodes = uVar2;
    fVar6 = xr_reader::r_float(r);
    this->m_size = fVar6;
    fVar6 = xr_reader::r_float(r);
    this->m_size_y = fVar6;
    xr_reader::r_fvector3(r,(fvector3 *)&this->m_aabb);
    xr_reader::r_fvector3(r,&(this->m_aabb).field_0.field_0.max);
    if (7 < this->m_version) {
      xr_guid::load(&this->m_guid,r);
    }
    if ((this->m_version < 3) || (6 < this->m_version)) {
      auVar1 = ZEXT416(this->m_num_nodes) * ZEXT816(0x1c);
      uVar3 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      paVar4 = (ai_node *)operator_new__(uVar3);
      this->m_nodes = paVar4;
      if (this->m_version < 10) {
        xr_reader::r_cseq<xray_re::ai_node,read_node_v8>(r,this->m_num_nodes,this->m_nodes);
      }
      else {
        xr_reader::r_cseq<xray_re::ai_node,read_node_v10>(r,this->m_num_nodes,this->m_nodes);
      }
    }
    else {
      this->m_num_nodes = 0;
      this->m_nodes = (ai_node *)0x0;
    }
    dVar7 = std::floor((double)(ulong)(uint)(((this->m_aabb).field_0.field_1.x2 -
                                             (this->m_aabb).field_0.field_1.x1) / this->m_size +
                                            1.501));
    this->m_column_length = (uint)(long)SUB84(dVar7,0);
    dVar7 = std::floor((double)(ulong)(uint)(((this->m_aabb).field_0.field_1.z2 -
                                             (this->m_aabb).field_0.field_1.z1) / this->m_size +
                                            1.501));
    this->m_row_length = (uint)(long)SUB84(dVar7,0);
    return;
  }
  __assert_fail("m_version >= AI_VERSION_4 && m_version <= AI_VERSION_10 || m_version == AI_VERSION_3"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_ai.cxx"
                ,0x4c,"void xray_re::xr_level_ai::load(xr_reader &)");
}

Assistant:

void xr_level_ai::load(xr_reader& r)
{
	m_version = r.r_u32();
	xr_assert(m_version >= AI_VERSION_4 && m_version <= AI_VERSION_10 || m_version == AI_VERSION_3);
	m_num_nodes = r.r_u32();
	m_size = r.r_float();
	m_size_y = r.r_float();
	r.r_fvector3(m_aabb.min);
	r.r_fvector3(m_aabb.max);
	if (m_version >= AI_VERSION_8)
		m_guid.load(r);

	if (m_version >= AI_VERSION_3 && m_version <= AI_VERSION_6) {
		m_num_nodes = 0; // because unknown format
		m_nodes = 0;
	} else {
		m_nodes = new ai_node[m_num_nodes];
		if (m_version >= AI_VERSION_10)
			r.r_cseq(m_num_nodes, m_nodes, read_node_v10());
		else
			r.r_cseq(m_num_nodes, m_nodes, read_node_v8());
	}

	m_column_length = unsigned(std::floor((m_aabb.max.x - m_aabb.min.x)/m_size + 1.501f));
	m_row_length = unsigned(std::floor((m_aabb.max.z - m_aabb.min.z)/m_size + 1.501f));
}